

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToFront(ImGuiWindow *window)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  uint i;
  value_type in_RDI;
  value_type local_28;
  
  pIVar1 = GImGui;
  this = &GImGui->Windows;
  ppIVar2 = ImVector<ImGuiWindow_*>::back(this);
  if ((*ppIVar2 != in_RDI) && ((*ppIVar2)->RootWindow != in_RDI)) {
    for (i = this->Size - 2; -1 < (int)i; i = i - 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i);
      if (*ppIVar2 == in_RDI) {
        ImVector<ImGuiWindow_*>::erase(this,(pIVar1->Windows).Data + i);
        ImVector<ImGuiWindow_*>::push_back(this,&local_28);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.Data + i);
            g.Windows.push_back(window);
            break;
        }
}